

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

int __thiscall
baryonyx::itm::compute_order::
infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>const,baryonyx::bit_array>
          (compute_order *this,
          solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
          *solver,bit_array *x)

{
  uint uVar1;
  bound_factor *pbVar2;
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  pointer ppVar8;
  _Head_base<0UL,_int_*,_false> _Var9;
  pointer ppVar10;
  ulong uVar11;
  ulong uVar12;
  long in_R9;
  undefined1 auVar13 [16];
  undefined1 auVar15 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar14 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  undefined1 auVar34 [64];
  _Head_base<0UL,_int_*,_false> local_50;
  _Head_base<0UL,_int_*,_false> local_48;
  _Head_base<0UL,_int_*,_false> local_40;
  bit_array *local_38;
  undefined1 auVar16 [32];
  undefined1 auVar19 [32];
  
  ppVar8 = (this->m_order).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar8) {
    (this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar8;
  }
  uVar1 = solver->m;
  ppVar10 = ppVar8;
  if ((ulong)uVar1 != 0) {
    uVar11 = 0;
    local_40._M_head_impl = (int *)this;
    local_38 = x;
    do {
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_50,(int)solver + 0x10);
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      vpmovsxbd_avx2(ZEXT816(0x3830282018100800));
      auVar19._8_4_ = 0xffffffc0;
      auVar19._0_8_ = 0xffffffc0ffffffc0;
      auVar19._12_4_ = 0xffffffc0;
      auVar19._16_4_ = 0xffffffc0;
      auVar19._20_4_ = 0xffffffc0;
      auVar19._24_4_ = 0xffffffc0;
      auVar19._28_4_ = 0xffffffc0;
      auVar21 = vpbroadcastq_avx512f(ZEXT816(1));
      iVar26 = 0;
      if (local_48._M_head_impl != local_50._M_head_impl) {
        uVar12 = 0;
        auVar22 = vpbroadcastq_avx512f();
        auVar22 = vpsrlq_avx512f(auVar22,3);
        auVar34 = ZEXT1664((undefined1  [16])0x0);
        _Var9._M_head_impl = local_48._M_head_impl;
        do {
          auVar23 = vpbroadcastq_avx512f();
          uVar12 = uVar12 + 8;
          auVar23 = vporq_avx512f(auVar23,auVar20);
          uVar5 = vpcmpuq_avx512f(auVar23,auVar22,2);
          auVar14 = vpgatherdd_avx512vl(*(undefined4 *)((long)_Var9._M_head_impl + in_R9));
          bVar3 = (byte)uVar5;
          auVar15._4_4_ = (uint)((byte)(uVar5 >> 1) & 1) * auVar14._4_4_;
          auVar15._0_4_ = (uint)(bVar3 & 1) * auVar14._0_4_;
          auVar15._8_4_ = (uint)((byte)(uVar5 >> 2) & 1) * auVar14._8_4_;
          auVar15._12_4_ = (uint)((byte)(uVar5 >> 3) & 1) * auVar14._12_4_;
          auVar15._16_4_ = (uint)((byte)(uVar5 >> 4) & 1) * auVar14._16_4_;
          auVar15._20_4_ = (uint)((byte)(uVar5 >> 5) & 1) * auVar14._20_4_;
          auVar15._24_4_ = (uint)((byte)(uVar5 >> 6) & 1) * auVar14._24_4_;
          auVar15._28_4_ = (uint)(byte)(uVar5 >> 7) * auVar14._28_4_;
          auVar14 = vpsrad_avx2(auVar15,0x1f);
          auVar14 = vpsrld_avx2(auVar14,0x1a);
          auVar14 = vpaddd_avx2(auVar15,auVar14);
          vpsrad_avx2(auVar14,6);
          auVar14 = vpand_avx2(auVar19,auVar14);
          auVar14 = vpsubd_avx2(auVar15,auVar14);
          auVar23 = vpgatherdq_avx512f((int)(solver->A).super_bit_array_impl.m_data._M_t.
                                            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                            .super__Head_base<0UL,_unsigned_long_*,_false>.
                                            _M_head_impl[uVar11]);
          auVar24._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar23._8_8_;
          auVar24._0_8_ = (ulong)(bVar3 & 1) * auVar23._0_8_;
          auVar24._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar23._16_8_;
          auVar24._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar23._24_8_;
          auVar24._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar23._32_8_;
          auVar24._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar23._40_8_;
          auVar24._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar23._48_8_;
          auVar24._56_8_ = (uVar5 >> 7) * auVar23._56_8_;
          auVar15 = vpgatherdd_avx512vl(*(undefined4 *)((long)_Var9._M_head_impl + in_R9 + 4));
          auVar16._4_4_ = (uint)((byte)(uVar5 >> 1) & 1) * auVar15._4_4_;
          auVar16._0_4_ = (uint)(bVar3 & 1) * auVar15._0_4_;
          auVar16._8_4_ = (uint)((byte)(uVar5 >> 2) & 1) * auVar15._8_4_;
          auVar16._12_4_ = (uint)((byte)(uVar5 >> 3) & 1) * auVar15._12_4_;
          auVar16._16_4_ = (uint)((byte)(uVar5 >> 4) & 1) * auVar15._16_4_;
          auVar16._20_4_ = (uint)((byte)(uVar5 >> 5) & 1) * auVar15._20_4_;
          auVar16._24_4_ = (uint)((byte)(uVar5 >> 6) & 1) * auVar15._24_4_;
          auVar16._28_4_ = (uint)(byte)(uVar5 >> 7) * auVar15._28_4_;
          auVar23 = vpmovzxdq_avx512f(auVar14);
          _Var9._M_head_impl = _Var9._M_head_impl + 0x10;
          auVar23 = vpsrlvq_avx512f(auVar24,auVar23);
          auVar14 = vpsrad_avx2(auVar16,0x1f);
          vpandq_avx512f(auVar23,auVar21);
          auVar14 = vpsrld_avx2(auVar14,0x1a);
          auVar14 = vpaddd_avx2(auVar16,auVar14);
          vpsrad_avx2(auVar14,6);
          auVar14 = vpand_avx2(auVar19,auVar14);
          auVar23 = vpgatherdq_avx512f(*(undefined4 *)
                                        ((long)(local_38->super_bit_array_impl).m_data._M_t.
                                               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                               .super__Head_base<0UL,_unsigned_long_*,_false>.
                                               _M_head_impl * 9));
          auVar25._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar23._8_8_;
          auVar25._0_8_ = (ulong)(bVar3 & 1) * auVar23._0_8_;
          auVar25._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar23._16_8_;
          auVar25._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar23._24_8_;
          auVar25._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar23._32_8_;
          auVar25._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar23._40_8_;
          auVar25._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar23._48_8_;
          auVar25._56_8_ = (uVar5 >> 7) * auVar23._56_8_;
          auVar14 = vpsubd_avx2(auVar16,auVar14);
          auVar23 = vpmovzxdq_avx512f(auVar14);
          auVar14 = vpgatherqd_avx512f(*(undefined8 *)
                                        (value_bit_array<-1,_1>::return_value + (long)&local_50));
          auVar17._4_4_ = (uint)((byte)(uVar5 >> 1) & 1) * auVar14._4_4_;
          auVar17._0_4_ = (uint)(bVar3 & 1) * auVar14._0_4_;
          auVar17._8_4_ = (uint)((byte)(uVar5 >> 2) & 1) * auVar14._8_4_;
          auVar17._12_4_ = (uint)((byte)(uVar5 >> 3) & 1) * auVar14._12_4_;
          auVar17._16_4_ = (uint)((byte)(uVar5 >> 4) & 1) * auVar14._16_4_;
          auVar17._20_4_ = (uint)((byte)(uVar5 >> 5) & 1) * auVar14._20_4_;
          auVar17._24_4_ = (uint)((byte)(uVar5 >> 6) & 1) * auVar14._24_4_;
          auVar17._28_4_ = (uint)(byte)(uVar5 >> 7) * auVar14._28_4_;
          auVar23 = vpsrlvq_avx512f(auVar25,auVar23);
          uVar6 = vptestmq_avx512f(auVar23,auVar21);
          auVar14 = vpaddd_avx512vl(auVar34._0_32_,auVar17);
          bVar4 = (bool)((byte)uVar6 & 1);
          iVar26 = auVar34._0_4_;
          auVar18._0_4_ = (uint)bVar4 * auVar14._0_4_ | (uint)!bVar4 * iVar26;
          bVar4 = (bool)((byte)(uVar6 >> 1) & 1);
          iVar27 = auVar34._4_4_;
          auVar18._4_4_ = (uint)bVar4 * auVar14._4_4_ | (uint)!bVar4 * iVar27;
          bVar4 = (bool)((byte)(uVar6 >> 2) & 1);
          iVar28 = auVar34._8_4_;
          auVar18._8_4_ = (uint)bVar4 * auVar14._8_4_ | (uint)!bVar4 * iVar28;
          bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
          iVar29 = auVar34._12_4_;
          auVar18._12_4_ = (uint)bVar4 * auVar14._12_4_ | (uint)!bVar4 * iVar29;
          bVar4 = (bool)((byte)(uVar6 >> 4) & 1);
          iVar30 = auVar34._16_4_;
          auVar18._16_4_ = (uint)bVar4 * auVar14._16_4_ | (uint)!bVar4 * iVar30;
          bVar4 = (bool)((byte)(uVar6 >> 5) & 1);
          iVar31 = auVar34._20_4_;
          auVar18._20_4_ = (uint)bVar4 * auVar14._20_4_ | (uint)!bVar4 * iVar31;
          bVar4 = (bool)((byte)(uVar6 >> 6) & 1);
          iVar32 = auVar34._24_4_;
          auVar18._24_4_ = (uint)bVar4 * auVar14._24_4_ | (uint)!bVar4 * iVar32;
          bVar4 = SUB81(uVar6 >> 7,0);
          iVar33 = auVar34._28_4_;
          auVar18._28_4_ = (uint)bVar4 * auVar14._28_4_ | (uint)!bVar4 * iVar33;
          auVar34 = ZEXT3264(auVar18);
        } while (((((long)local_50._M_head_impl - (long)local_48._M_head_impl) - 8U >> 3) + 8 &
                 0xfffffffffffffff8) != uVar12);
        auVar19 = vmovdqa32_avx512vl(auVar18);
        auVar13._0_4_ = (uint)(bVar3 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar3 & 1) * iVar26;
        bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
        auVar13._4_4_ = (uint)bVar4 * auVar19._4_4_ | (uint)!bVar4 * iVar27;
        bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
        auVar13._8_4_ = (uint)bVar4 * auVar19._8_4_ | (uint)!bVar4 * iVar28;
        bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
        auVar13._12_4_ = (uint)bVar4 * auVar19._12_4_ | (uint)!bVar4 * iVar29;
        bVar4 = (bool)((byte)(uVar5 >> 4) & 1);
        auVar14._16_4_ = (uint)bVar4 * auVar19._16_4_ | (uint)!bVar4 * iVar30;
        auVar14._0_16_ = auVar13;
        bVar4 = (bool)((byte)(uVar5 >> 5) & 1);
        auVar14._20_4_ = (uint)bVar4 * auVar19._20_4_ | (uint)!bVar4 * iVar31;
        bVar4 = (bool)((byte)(uVar5 >> 6) & 1);
        auVar14._24_4_ = (uint)bVar4 * auVar19._24_4_ | (uint)!bVar4 * iVar32;
        bVar4 = SUB81(uVar5 >> 7,0);
        auVar14._28_4_ = (uint)bVar4 * auVar19._28_4_ | (uint)!bVar4 * iVar33;
        auVar13 = vphaddd_avx(auVar14._16_16_,auVar13);
        auVar13 = vphaddd_avx(auVar13,auVar13);
        auVar13 = vphaddd_avx(auVar13,auVar13);
        iVar26 = auVar13._0_4_;
      }
      pbVar2 = (solver->b)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor_*,_false>
               ._M_head_impl;
      iVar27 = pbVar2[uVar11].min;
      uVar7 = iVar27 - iVar26;
      if ((uVar7 != 0 && iVar26 <= iVar27) ||
         (iVar27 = pbVar2[uVar11].max, uVar7 = iVar26 - iVar27, uVar7 != 0 && iVar27 <= iVar26)) {
        local_50._M_head_impl = (int *)((ulong)uVar7 << 0x20 | uVar11);
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->m_order,
                   (pair<int,_int> *)&local_50);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar1);
    ppVar10 = (((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               ((long)local_40._M_head_impl + 0x18))->
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppVar8 = *(pointer *)((long)local_40._M_head_impl + 0x20);
  }
  return (int)((ulong)((long)ppVar8 - (long)ppVar10) >> 3);
}

Assistant:

int infeasibility_local_compute_violated_constraints(Solver& solver,
                                                         const Xtype& x)
    {
        m_order.clear();

        for (int k = 0, e = solver.m; k != e; ++k) {
            sparse_matrix<int>::const_row_iterator it, et;
            std::tie(it, et) = solver.ap.row(k);
            int v = 0;

            for (; it != et; ++it)
                v += solver.factor(it->value) * x[it->column];

            if (solver.bound_min(k) > v)
                m_order.push_back(std::make_pair(k, solver.bound_min(k) - v));
            else if (solver.bound_max(k) < v)
                m_order.push_back(std::make_pair(k, v - solver.bound_max(k)));
        }

        return length(m_order);
    }